

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O0

bool SpeedKyber(string *selected)

{
  bool bVar1;
  ulong uVar2;
  allocator<char> local_4061;
  string local_4060;
  anon_class_24_3_28c6906a local_4040;
  function<bool_()> local_4028;
  undefined1 local_4008 [8];
  KYBER_public_key pub;
  uint8_t encoded_public_key [1184];
  KYBER_private_key priv;
  anon_class_8_1_88d27776 local_490;
  function<bool_()> local_488;
  uint8_t local_468 [8];
  uint8_t ciphertext [1088];
  TimeResults results;
  string *selected_local;
  
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (bVar1 = std::operator!=(selected,"Kyber"), bVar1)) {
    selected_local._7_1_ = true;
  }
  else {
    memset((uint8_t (*) [1088])local_468,0x2a,0x440);
    local_490.ciphertext = (uint8_t (*) [1088])local_468;
    std::function<bool()>::function<SpeedKyber(std::__cxx11::string_const&)::__0,void>
              ((function<bool()> *)&local_488,&local_490);
    bVar1 = TimeFunctionParallel((TimeResults *)(ciphertext + 0x438),&local_488);
    std::function<bool_()>::~function(&local_488);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(priv.opaque.bytes + 0x1e5a),"Kyber generate + decap",
                 (allocator<char> *)(priv.opaque.bytes + 0x1e59));
      TimeResults::Print((TimeResults *)(ciphertext + 0x438),(string *)((long)&priv.opaque + 0x1e5a)
                        );
      std::__cxx11::string::~string((string *)(priv.opaque.bytes + 0x1e5a));
      std::allocator<char>::~allocator((allocator<char> *)(priv.opaque.bytes + 0x1e59));
      KYBER_generate_key(pub.opaque.bytes + 0x1838,(KYBER_private_key *)(encoded_public_key + 0x49e)
                        );
      local_4040.pub = (KYBER_public_key *)local_4008;
      local_4040.ciphertext = (uint8_t (*) [1088])local_468;
      local_4040.encoded_public_key = (uint8_t (*) [1184])(pub.opaque.bytes + 0x1838);
      std::function<bool()>::function<SpeedKyber(std::__cxx11::string_const&)::__1,void>
                ((function<bool()> *)&local_4028,&local_4040);
      bVar1 = TimeFunctionParallel((TimeResults *)(ciphertext + 0x438),&local_4028);
      std::function<bool_()>::~function(&local_4028);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4060,"Kyber parse + encap",&local_4061);
        TimeResults::Print((TimeResults *)(ciphertext + 0x438),&local_4060);
        std::__cxx11::string::~string((string *)&local_4060);
        std::allocator<char>::~allocator(&local_4061);
        selected_local._7_1_ = true;
      }
      else {
        fprintf(_stderr,"Failed to time KYBER_encap.\n");
        selected_local._7_1_ = false;
      }
    }
    else {
      fprintf(_stderr,"Failed to time KYBER_generate_key + KYBER_decap.\n");
      selected_local._7_1_ = false;
    }
  }
  return selected_local._7_1_;
}

Assistant:

static bool SpeedKyber(const std::string &selected) {
  if (!selected.empty() && selected != "Kyber") {
    return true;
  }

  TimeResults results;

  uint8_t ciphertext[KYBER_CIPHERTEXT_BYTES];
  // This ciphertext is nonsense, but Kyber decap is constant-time so, for the
  // purposes of timing, it's fine.
  memset(ciphertext, 42, sizeof(ciphertext));
  if (!TimeFunctionParallel(&results, [&]() -> bool {
        KYBER_private_key priv;
        uint8_t encoded_public_key[KYBER_PUBLIC_KEY_BYTES];
        KYBER_generate_key(encoded_public_key, &priv);
        uint8_t shared_secret[KYBER_SHARED_SECRET_BYTES];
        KYBER_decap(shared_secret, ciphertext, &priv);
        return true;
      })) {
    fprintf(stderr, "Failed to time KYBER_generate_key + KYBER_decap.\n");
    return false;
  }

  results.Print("Kyber generate + decap");

  KYBER_private_key priv;
  uint8_t encoded_public_key[KYBER_PUBLIC_KEY_BYTES];
  KYBER_generate_key(encoded_public_key, &priv);
  KYBER_public_key pub;
  if (!TimeFunctionParallel(&results, [&]() -> bool {
        CBS encoded_public_key_cbs;
        CBS_init(&encoded_public_key_cbs, encoded_public_key,
                 sizeof(encoded_public_key));
        if (!KYBER_parse_public_key(&pub, &encoded_public_key_cbs)) {
          return false;
        }
        uint8_t shared_secret[KYBER_SHARED_SECRET_BYTES];
        KYBER_encap(ciphertext, shared_secret, &pub);
        return true;
      })) {
    fprintf(stderr, "Failed to time KYBER_encap.\n");
    return false;
  }

  results.Print("Kyber parse + encap");

  return true;
}